

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,string *rule,
          cmNinjaDeps *outputs,cmNinjaDeps *implicitOuts,cmNinjaDeps *explicitDeps,
          cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,cmNinjaVars *variables,
          string *rspfile,int cmdLineLimit,bool *usedResponseFile)

{
  cmGlobalNinjaGenerator *pcVar1;
  bool bVar2;
  long *plVar3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *pcVar8;
  undefined1 this_00 [8];
  pointer m2;
  string *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer path;
  char *__end;
  string assignments;
  string arguments;
  ostringstream variable_assignments;
  string local_2b8;
  string local_298;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_278;
  string local_270;
  cmGlobalNinjaGenerator *local_250;
  string local_248;
  cmNinjaDeps *local_228;
  cmNinjaDeps *local_220;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  uint local_1f4;
  cmNinjaDeps *local_1f0;
  string *local_1e8;
  bool *local_1e0;
  cmNinjaVars *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [8];
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_250 = this;
  local_220 = implicitOuts;
  if (rule->_M_string_length == 0) {
    m2 = (comment->_M_dataplus)._M_p;
    pcVar8 = "No rule for WriteBuildStatement! called with comment: ";
  }
  else {
    if ((outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1e0 = usedResponseFile;
      local_1f4 = cmdLineLimit;
      local_1e8 = rspfile;
      local_1d8 = variables;
      local_228 = orderOnlyDeps;
      local_278 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)implicitDeps;
      local_1f0 = outputs;
      local_1d0 = rule;
      WriteComment(os,comment);
      local_218 = &local_208;
      local_210 = 0;
      local_208 = '\0';
      psVar9 = (explicitDeps->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (psVar9 != (explicitDeps->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          EncodePath(&local_2b8,(cmGlobalNinjaGenerator *)comment,psVar9);
          EncodeIdent(&local_298,&local_2b8,os);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x5777db);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar10) {
            local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar3[3];
            local_1a8 = (undefined1  [8])local_198;
          }
          else {
            local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
            local_1a8 = (undefined1  [8])*plVar3;
          }
          local_1a0 = plVar3[1];
          *plVar3 = (long)paVar10;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          comment = (string *)local_1a8;
          std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            comment = (string *)(local_198[0]._M_allocated_capacity + 1);
            operator_delete((void *)local_1a8,(ulong)comment);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            comment = (string *)
                      (CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                local_298.field_2._M_local_buf[0]) + 1);
            operator_delete(local_298._M_dataplus._M_p,(ulong)comment);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            comment = (string *)(local_2b8.field_2._M_allocated_capacity + 1);
            operator_delete(local_2b8._M_dataplus._M_p,(ulong)comment);
          }
          psVar9 = psVar9 + 1;
        } while (psVar9 != (explicitDeps->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      if (*(long *)local_278 != *(long *)(local_278 + 8)) {
        pcVar8 = " |";
        std::__cxx11::string::append((char *)&local_218);
        psVar9 = *(string **)local_278;
        if (psVar9 != *(string **)(local_278 + 8)) {
          do {
            EncodePath(&local_2b8,(cmGlobalNinjaGenerator *)pcVar8,psVar9);
            EncodeIdent(&local_298,&local_2b8,os);
            plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x5777db)
            ;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 == paVar10) {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar3[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_1a8 = (undefined1  [8])*plVar3;
            }
            local_1a0 = plVar3[1];
            *plVar3 = (long)paVar10;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            pcVar8 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar8 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              pcVar8 = (char *)(CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                         local_298.field_2._M_local_buf[0]) + 1);
              operator_delete(local_298._M_dataplus._M_p,(ulong)pcVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              pcVar8 = (char *)(local_2b8.field_2._M_allocated_capacity + 1);
              operator_delete(local_2b8._M_dataplus._M_p,(ulong)pcVar8);
            }
            psVar9 = psVar9 + 1;
          } while (psVar9 != *(string **)(local_278 + 8));
        }
      }
      if ((local_228->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_228->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar8 = " ||";
        std::__cxx11::string::append((char *)&local_218);
        psVar9 = (local_228->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (psVar9 != (local_228->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            EncodePath(&local_2b8,(cmGlobalNinjaGenerator *)pcVar8,psVar9);
            EncodeIdent(&local_298,&local_2b8,os);
            plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x5777db)
            ;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 == paVar10) {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar3[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_1a8 = (undefined1  [8])*plVar3;
            }
            local_1a0 = plVar3[1];
            *plVar3 = (long)paVar10;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            pcVar8 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar8 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              pcVar8 = (char *)(CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                         local_298.field_2._M_local_buf[0]) + 1);
              operator_delete(local_298._M_dataplus._M_p,(ulong)pcVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              pcVar8 = (char *)(local_2b8.field_2._M_allocated_capacity + 1);
              operator_delete(local_2b8._M_dataplus._M_p,(ulong)pcVar8);
            }
            psVar9 = psVar9 + 1;
          } while (psVar9 != (local_228->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::__cxx11::string::append((char *)&local_218);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      this_00 = (undefined1  [8])0x586ed8;
      std::__cxx11::string::append((char *)&local_298);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1f0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      if (paVar10 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1f0->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
        local_278 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&local_250->CombinedBuildOutputs;
        do {
          EncodePath(&local_270,(cmGlobalNinjaGenerator *)this_00,(string *)paVar10);
          EncodeIdent(&local_2b8,&local_270,os);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x5777db);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar7) {
            local_198[0]._0_8_ = paVar7->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar3[3];
            local_1a8 = (undefined1  [8])local_198;
          }
          else {
            local_198[0]._0_8_ = paVar7->_M_allocated_capacity;
            local_1a8 = (undefined1  [8])*plVar3;
          }
          local_1a0 = plVar3[1];
          *plVar3 = (long)paVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          this_00 = local_1a8;
          std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            this_00 = (undefined1  [8])(local_198[0]._M_allocated_capacity + 1);
            operator_delete((void *)local_1a8,(ulong)this_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            this_00 = (undefined1  [8])(local_2b8.field_2._M_allocated_capacity + 1);
            operator_delete(local_2b8._M_dataplus._M_p,(ulong)this_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            this_00 = (undefined1  [8])(local_270.field_2._M_allocated_capacity + 1);
            operator_delete(local_270._M_dataplus._M_p,(ulong)this_00);
          }
          if (local_250->ComputingUnknownDependencies == true) {
            this_00 = (undefined1  [8])paVar10;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_278,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar10)
            ;
          }
          paVar10 = paVar10 + 2;
        } while ((pointer)paVar10 !=
                 (local_1f0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((local_220->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_220->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar8 = " |";
        std::__cxx11::string::append((char *)&local_298);
        path = (local_220->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
        if (path != (local_220->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            EncodePath(&local_270,(cmGlobalNinjaGenerator *)pcVar8,path);
            EncodeIdent(&local_2b8,&local_270,os);
            plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x5777db)
            ;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 == paVar10) {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar3[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_1a8 = (undefined1  [8])*plVar3;
            }
            local_1a0 = plVar3[1];
            *plVar3 = (long)paVar10;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            pcVar8 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar8 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              pcVar8 = (char *)(local_2b8.field_2._M_allocated_capacity + 1);
              operator_delete(local_2b8._M_dataplus._M_p,(ulong)pcVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              pcVar8 = (char *)(local_270.field_2._M_allocated_capacity + 1);
              operator_delete(local_270._M_dataplus._M_p,(ulong)pcVar8);
            }
            path = path + 1;
          } while (path != (local_220->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::__cxx11::string::append((char *)&local_298);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     " ",local_1d0);
      std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      local_250 = (cmGlobalNinjaGenerator *)os;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      p_Var5 = (local_1d8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 = &(local_1d8->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var5 != p_Var4) {
        do {
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"","");
          WriteVariable((ostream *)local_1a8,(string *)(p_Var5 + 1),(string *)(p_Var5 + 2),
                        &local_2b8,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var4);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      std::__cxx11::stringbuf::str();
      pcVar1 = local_250;
      if (((int)local_1f4 < 0) ||
         ((local_1f4 != 0 &&
          ((ulong)local_1f4 <
           local_210 + local_2b8._M_string_length + local_270._M_string_length + 1000)))) {
        paVar10 = &local_248.field_2;
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        local_248._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::stringbuf::str((string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar10) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        local_248._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"RSP_FILE","");
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
        WriteVariable((ostream *)local_1a8,&local_248,local_1e8,&local_1c8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar10) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_248._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar10) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      if (local_1e0 != (bool *)0x0) {
        *local_1e0 = bVar2;
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)pcVar1,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_218,local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_270._M_dataplus._M_p,local_270._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if (local_218 != &local_208) {
        operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
      }
      return;
    }
    m2 = (comment->_M_dataplus)._M_p;
    pcVar8 = "No output files for WriteBuildStatement! called with comment: ";
  }
  cmSystemTools::Error(pcVar8,m2,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(
  std::ostream& os, const std::string& comment, const std::string& rule,
  const cmNinjaDeps& outputs, const cmNinjaDeps& implicitOuts,
  const cmNinjaDeps& explicitDeps, const cmNinjaDeps& implicitDeps,
  const cmNinjaDeps& orderOnlyDeps, const cmNinjaVars& variables,
  const std::string& rspfile, int cmdLineLimit, bool* usedResponseFile)
{
  // Make sure there is a rule.
  if (rule.empty()) {
    cmSystemTools::Error("No rule for WriteBuildStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
  }

  // Make sure there is at least one output file.
  if (outputs.empty()) {
    cmSystemTools::Error("No output files for WriteBuildStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  std::string arguments;

  // TODO: Better formatting for when there are multiple input/output files.

  // Write explicit dependencies.
  for (cmNinjaDeps::const_iterator i = explicitDeps.begin();
       i != explicitDeps.end(); ++i) {
    arguments += " " + EncodeIdent(EncodePath(*i), os);
  }

  // Write implicit dependencies.
  if (!implicitDeps.empty()) {
    arguments += " |";
    for (cmNinjaDeps::const_iterator i = implicitDeps.begin();
         i != implicitDeps.end(); ++i) {
      arguments += " " + EncodeIdent(EncodePath(*i), os);
    }
  }

  // Write order-only dependencies.
  if (!orderOnlyDeps.empty()) {
    arguments += " ||";
    for (cmNinjaDeps::const_iterator i = orderOnlyDeps.begin();
         i != orderOnlyDeps.end(); ++i) {
      arguments += " " + EncodeIdent(EncodePath(*i), os);
    }
  }

  arguments += "\n";

  std::string build;

  // Write outputs files.
  build += "build";
  for (cmNinjaDeps::const_iterator i = outputs.begin(); i != outputs.end();
       ++i) {
    build += " " + EncodeIdent(EncodePath(*i), os);
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(*i);
    }
  }
  if (!implicitOuts.empty()) {
    build += " |";
    for (cmNinjaDeps::const_iterator i = implicitOuts.begin();
         i != implicitOuts.end(); ++i) {
      build += " " + EncodeIdent(EncodePath(*i), os);
    }
  }
  build += ":";

  // Write the rule.
  build += " " + rule;

  // Write the variables bound to this build statement.
  std::ostringstream variable_assignments;
  for (cmNinjaVars::const_iterator i = variables.begin(); i != variables.end();
       ++i) {
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, i->first,
                                          i->second, "", 1);
  }

  // check if a response file rule should be used
  std::string buildstr = build;
  std::string assignments = variable_assignments.str();
  const std::string& args = arguments;
  bool useResponseFile = false;
  if (cmdLineLimit < 0 ||
      (cmdLineLimit > 0 &&
       (args.size() + buildstr.size() + assignments.size() + 1000) >
         static_cast<size_t>(cmdLineLimit))) {
    variable_assignments.str(std::string());
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, "RSP_FILE",
                                          rspfile, "", 1);
    assignments += variable_assignments.str();
    useResponseFile = true;
  }
  if (usedResponseFile) {
    *usedResponseFile = useResponseFile;
  }

  os << buildstr << args << assignments;
}